

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void outerproduct(float32 **a,float32 *x,float32 *y,int32 len)

{
  float32 *pfVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar2 = 0;
  uVar3 = 0;
  if (0 < len) {
    uVar3 = (ulong)(uint)len;
  }
  for (; uVar2 != uVar3; uVar2 = uVar2 + 1) {
    pfVar1 = a[uVar2];
    pfVar1[uVar2] = (float32)((float)x[uVar2] * (float)y[uVar2]);
    for (uVar4 = uVar2; (int)uVar4 + 1 < len; uVar4 = uVar4 + 1) {
      pfVar1[uVar4 + 1] = (float32)((float)x[uVar2] * (float)y[uVar4 + 1]);
      a[uVar4 + 1][uVar2] = (float32)((float)x[uVar4 + 1] * (float)y[uVar2]);
    }
  }
  return;
}

Assistant:

void
outerproduct(float32 ** a, float32 * x, float32 * y, int32 len)
{
    int32 i, j;

    for (i = 0; i < len; ++i) {
        a[i][i] = x[i] * y[i];
        for (j = i + 1; j < len; ++j) {
            a[i][j] = x[i] * y[j];
            a[j][i] = x[j] * y[i];
        }
    }
}